

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

Privkey * cfd::core::ConfidentialTransaction::GetIssuanceBlindingKey
                    (Privkey *__return_storage_ptr__,Privkey *master_blinding_key,Txid *txid,
                    uint32_t vout)

{
  ScriptBuilder builder;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  ByteData256 data;
  Script script;
  int64_t vout64;
  
  builder._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_005ba258;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ScriptBuilder::AppendOperator(&builder,(ScriptOperator *)ScriptOperator::OP_RETURN);
  Txid::GetData((ByteData *)&script,txid);
  ScriptBuilder::AppendData(&builder,(ByteData *)&script);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
  vout64 = (int64_t)vout;
  ScriptBuilder::AppendData(&builder,&vout64);
  ScriptBuilder::Build(&script,&builder);
  Privkey::GetData((ByteData *)&local_a8,master_blinding_key);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
                     (ByteData *)&local_a8);
  Script::GetData((ByteData *)&local_c0,&script);
  CryptoUtil::HmacSha256
            (&data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
             (ByteData *)&local_c0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  Privkey::Privkey(__return_storage_ptr__,&data,kMainnet,true);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  Script::~Script(&script);
  ScriptBuilder::~ScriptBuilder(&builder);
  return __return_storage_ptr__;
}

Assistant:

Privkey ConfidentialTransaction::GetIssuanceBlindingKey(
    const Privkey &master_blinding_key, const Txid &txid, uint32_t vout) {
  // script: OP_RETURN <txid> <vout>
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_RETURN);
  builder.AppendData(txid.GetData());
  int64_t vout64 = vout;
  builder.AppendData(vout64);
  Script script = builder.Build();

  ByteData256 data = CryptoUtil::HmacSha256(
      master_blinding_key.GetData().GetBytes(), script.GetData());
  return Privkey(data);
}